

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::CreateInstance
          (ArenaStringPtr *this,Arena *arena,string *initial_value)

{
  LogMessage *other;
  string *this_00;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  string *local_20;
  string *initial_value_local;
  Arena *arena_local;
  ArenaStringPtr *this_local;
  
  local_59 = 0;
  local_20 = initial_value;
  initial_value_local = (string *)arena;
  arena_local = (Arena *)this;
  if (initial_value == (string *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/arenastring.h"
               ,0x128);
    local_59 = 1;
    other = LogMessage::operator<<(&local_58,"CHECK failed: initial_value != NULL: ");
    LogFinisher::operator=(local_6d,other);
  }
  if ((local_59 & 1) != 0) {
    LogMessage::~LogMessage(&local_58);
  }
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,(string *)local_20);
  this->ptr_ = this_00;
  if (initial_value_local != (string *)0x0) {
    Arena::Own<std::__cxx11::string>((Arena *)initial_value_local,this->ptr_);
  }
  return;
}

Assistant:

GOOGLE_ATTRIBUTE_NOINLINE void CreateInstance(::google::protobuf::Arena* arena,
                                         const ::std::string* initial_value) {
    GOOGLE_DCHECK(initial_value != NULL);
    ptr_ = new ::std::string(*initial_value);
    if (arena != NULL) {
      arena->Own(ptr_);
    }
  }